

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::Dummy(ImVec2 *size)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ImRect bb;
  ImRect local_18;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    IVar1 = (pIVar2->DC).CursorPos;
    auVar3._8_8_ = 0;
    auVar3._0_4_ = IVar1.x;
    auVar3._4_4_ = IVar1.y;
    auVar4._0_4_ = IVar1.x + (*size).x;
    auVar4._4_4_ = IVar1.y + (*size).y;
    auVar4._8_8_ = 0;
    local_18 = (ImRect)vmovlhps_avx(auVar3,auVar4);
    ItemSize(size,-1.0);
    ItemAdd(&local_18,0,(ImRect *)0x0);
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }